

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O0

double Abc_GraphCountPaths_rec
                 (int Lev,int Node,Vec_Wec_t *vNodes,double **pCache,int *pBuffer,Vec_Int_t *vEdges)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  double dVar3;
  double Res1;
  double Res0;
  Vec_Int_t *vEdges_local;
  int *pBuffer_local;
  double **pCache_local;
  Vec_Wec_t *vNodes_local;
  int Node_local;
  int Lev_local;
  
  if (Node == -2) {
    _Node_local = 1.0;
  }
  else if (Node == -1) {
    _Node_local = 0.0;
  }
  else if ((pCache[Lev][Node] != -1.0) || (NAN(pCache[Lev][Node]))) {
    _Node_local = pCache[Lev][Node];
  }
  else {
    pBuffer[Lev] = 0;
    pVVar2 = Vec_WecEntry(vNodes,Lev);
    iVar1 = Vec_IntEntry(pVVar2,Node << 1);
    _Node_local = Abc_GraphCountPaths_rec(Lev + 1,iVar1,vNodes,pCache,pBuffer,vEdges);
    pBuffer[Lev] = 1;
    pVVar2 = Vec_WecEntry(vNodes,Lev);
    iVar1 = Vec_IntEntry(pVVar2,Node * 2 + 1);
    dVar3 = Abc_GraphCountPaths_rec(Lev + 1,iVar1,vNodes,pCache,pBuffer,vEdges);
    _Node_local = _Node_local + dVar3;
    pCache[Lev][Node] = _Node_local;
  }
  return _Node_local;
}

Assistant:

double Abc_GraphCountPaths_rec( int Lev, int Node, Vec_Wec_t * vNodes, double ** pCache, int * pBuffer, Vec_Int_t * vEdges )
{
    double Res0, Res1;
//    if ( Node == -2 ) Abc_GraphPathPrint4( pBuffer, vEdges );
    if ( Node == -2 )
        return 1;
    if ( Node == -1 )
        return 0;
    if ( pCache[Lev][Node] != -1.0 )
        return pCache[Lev][Node];
    pBuffer[Lev] = 0;
    Res0 = Abc_GraphCountPaths_rec( Lev+1, Vec_IntEntry( Vec_WecEntry(vNodes, Lev), 2*Node   ), vNodes, pCache, pBuffer, vEdges );
    pBuffer[Lev] = 1;
    Res1 = Abc_GraphCountPaths_rec( Lev+1, Vec_IntEntry( Vec_WecEntry(vNodes, Lev), 2*Node+1 ), vNodes, pCache, pBuffer, vEdges );
    return (pCache[Lev][Node] = Res0 + Res1);
}